

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O3

void __thiscall xtest::AssertFail::~AssertFail(AssertFail *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__AssertFail_00105d58;
  pcVar2 = (this->m_message)._M_dataplus._M_p;
  paVar1 = &(this->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

AssertFail(const char *case_name,const char *msg,const char *file_path,unsigned int line){
            std::stringstream ss;
            ss << "[ASSERT]"
               << '\"'
               #if XTEST_OUTPUT_FULL_PATH
               << file_path
               #else
               << getFileName(file_path)
               #endif
               << "\" line "
               << line
               << " in \""
               << case_name
               << "\": "
               << msg;
            m_message = ss.str();
        }